

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O2

void demo2(void)

{
  ostream *poVar1;
  allocator local_4c1;
  string local_4c0;
  Param param;
  IMLE imleObj;
  
  IMLE::Param::Param(&param,1,1);
  imleObj.d = 1;
  imleObj.D = 0;
  imleObj.param.accelerated = true;
  imleObj.param._9_7_ = 0x3fb99999999999;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&param.Psi0,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&imleObj);
  param.sigma0 = 1.0;
  param.p0 = 0.2;
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Param constructor: ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE::IMLE(&imleObj,1,1,&param,0x800);
  std::__cxx11::string::string((string *)&local_4c0,"cos1D.xml",&local_4c1);
  IMLE::createDefaultParamFile(1,1,&local_4c0);
  std::__cxx11::string::_M_dispose();
  cos1D_testSaveLoadAndParamHandling<IMLE>(&imleObj);
  IMLE::~IMLE(&imleObj);
  IMLE::Param::~Param(&param);
  return;
}

Assistant:

void demo2()
{
    int d = 1;    //Input dimension
    int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE::Param param(d,D);
    param.Psi0 = IMLE::X::Constant(D,0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;

    // Param constructor:
    cout << "\t --- Param constructor: ---" << endl;
    IMLE imleObj(d,D,param);

    // Default Param File:
    IMLE::createDefaultParamFile(d,D,"cos1D.xml");

    cos1D_testSaveLoadAndParamHandling(imleObj );
}